

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O0

int pmx::ReadIndex(istream *stream,int size)

{
  uint local_24;
  ushort local_20;
  byte local_1d;
  int tmp32;
  uint16_t tmp16;
  uint8_t tmp8;
  int size_local;
  istream *stream_local;
  
  tmp32 = size;
  _tmp16 = stream;
  if (size == 1) {
    std::istream::read((char *)stream,(long)&local_1d);
    if (local_1d == 0xff) {
      stream_local._4_4_ = 0xffffffff;
    }
    else {
      stream_local._4_4_ = (uint)local_1d;
    }
  }
  else if (size == 2) {
    std::istream::read((char *)stream,(long)&local_20);
    if (local_20 == 0xffff) {
      stream_local._4_4_ = 0xffffffff;
    }
    else {
      stream_local._4_4_ = (uint)local_20;
    }
  }
  else if (size == 4) {
    std::istream::read((char *)stream,(long)&local_24);
    stream_local._4_4_ = local_24;
  }
  else {
    stream_local._4_4_ = 0xffffffff;
  }
  return stream_local._4_4_;
}

Assistant:

int ReadIndex(std::istream *stream, int size)
	{
		switch (size)
		{
		case 1:
			uint8_t tmp8;
			stream->read((char*) &tmp8, sizeof(uint8_t));
			if (255 == tmp8)
			{
				return -1;
			}
			else {
				return (int) tmp8;
			}
		case 2:
			uint16_t tmp16;
			stream->read((char*) &tmp16, sizeof(uint16_t));
			if (65535 == tmp16)
			{
				return -1;
			}
			else {
				return (int) tmp16;
			}
		case 4:
			int tmp32;
			stream->read((char*) &tmp32, sizeof(int));
			return tmp32;
		default:
			return -1;
		}
	}